

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void avgFinalize(sqlite3_context *context)

{
  double *pdVar1;
  
  if ((context->pMem->flags & 0x2000) == 0) {
    pdVar1 = (double *)createAggContext(context,0);
  }
  else {
    pdVar1 = (double *)context->pMem->z;
  }
  if ((pdVar1 != (double *)0x0) && (0 < (long)pdVar1[2])) {
    sqlite3VdbeMemSetDouble(context->pOut,*pdVar1 / (double)(long)pdVar1[2]);
    return;
  }
  return;
}

Assistant:

static void avgFinalize(sqlite3_context *context){
  SumCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  if( p && p->cnt>0 ){
    sqlite3_result_double(context, p->rSum/(double)p->cnt);
  }
}